

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

void __thiscall Assimp::LWOImporter::LoadLWO2PolygonTags(LWOImporter *this,uint length)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint *puVar4;
  byte *pbVar5;
  Layer *pLVar6;
  pointer pFVar7;
  Logger *this_00;
  runtime_error *this_01;
  byte *pbVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (3 < length) {
    puVar4 = (uint *)this->mFileBuffer;
    uVar11 = *puVar4;
    this->mFileBuffer = (uint8_t *)(puVar4 + 1);
    uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    if ((uVar11 == 0x53555246) || (uVar11 == 0x534d4750)) {
      pbVar5 = this->mFileBuffer;
      while (pbVar5 < (byte *)((long)puVar4 + (ulong)length)) {
        bVar1 = *pbVar5;
        pbVar8 = pbVar5 + 1;
        this->mFileBuffer = pbVar8;
        if (bVar1 == 0xff) {
          bVar1 = pbVar5[1];
          this->mFileBuffer = pbVar5 + 2;
          bVar2 = pbVar5[2];
          pbVar8 = pbVar5 + 3;
          this->mFileBuffer = pbVar8;
          uVar10 = (uint)bVar2 << 8 | (uint)bVar1 << 0x10;
          lVar12 = 4;
        }
        else {
          uVar10 = (uint)bVar1 << 8;
          lVar12 = 2;
        }
        bVar1 = *pbVar8;
        this->mFileBuffer = pbVar5 + lVar12;
        pLVar6 = this->mCurLayer;
        uVar9 = (ulong)((bVar1 | uVar10) + pLVar6->mFaceIDXOfs);
        uVar3 = *(ushort *)(pbVar5 + lVar12);
        this->mFileBuffer = (uint8_t *)((long)(pbVar5 + lVar12) + 2);
        pFVar7 = (pLVar6->mFaces).
                 super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (uVar9 < (ulong)((long)(pLVar6->mFaces).
                                  super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar7 >> 5)) {
          uVar10 = (uint)(ushort)(uVar3 << 8 | uVar3 >> 8);
          if (uVar11 == 0x534d4750) {
            pFVar7[uVar9].smoothGroup = uVar10;
          }
          else if (uVar11 == 0x53555246) {
            pFVar7[uVar9].surfaceIndex = uVar10;
          }
        }
        else {
          this_00 = DefaultLogger::get();
          Logger::warn(this_00,"LWO2: face index in PTAG is out of range");
        }
        pbVar5 = this->mFileBuffer;
      }
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"LWO: PTAG chunk is too small","");
  std::runtime_error::runtime_error(this_01,(string *)local_40);
  *(undefined ***)this_01 = &PTR__runtime_error_00896c98;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LWOImporter::LoadLWO2PolygonTags(unsigned int length)
{
    LE_NCONST uint8_t* const end = mFileBuffer+length;

    AI_LWO_VALIDATE_CHUNK_LENGTH(length,PTAG,4);
    uint32_t type = GetU4();

    if (type != AI_LWO_SURF && type != AI_LWO_SMGP)
        return;

    while (mFileBuffer < end)
    {
        unsigned int i = ReadVSizedIntLWO2(mFileBuffer) + mCurLayer->mFaceIDXOfs;
        unsigned int j = GetU2();

        if (i >= mCurLayer->mFaces.size())  {
            ASSIMP_LOG_WARN("LWO2: face index in PTAG is out of range");
            continue;
        }

        switch (type)   {

        case AI_LWO_SURF:
            mCurLayer->mFaces[i].surfaceIndex = j;
            break;
        case AI_LWO_SMGP: /* is that really used? */
            mCurLayer->mFaces[i].smoothGroup = j;
            break;
        };
    }
}